

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

string * __thiscall
upb::generator::(anonymous_namespace)::ToCIdent_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view str)

{
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  char local_68 [8];
  char *local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  char *local_10;
  
  s._M_len = str._M_len;
  local_68[0] = '\x01';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_60 = ".";
  local_58 = 1;
  local_50 = "_";
  local_48 = 1;
  local_40 = "/";
  local_38 = 1;
  local_30 = "_";
  local_28 = 1;
  local_20 = "-";
  local_18 = 1;
  local_10 = "_";
  s._M_str = local_68;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x3;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)this,s,replacements);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCIdent(absl::string_view str) {
  return absl::StrReplaceAll(str, {{".", "_"}, {"/", "_"}, {"-", "_"}});
}